

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_or_default_open_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_result mVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  ma_vfs *in_RSI;
  wchar_t *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == (wchar_t *)0x0) {
    mVar1 = ma_default_vfs_open_w
                      (in_RSI,(wchar_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       (ma_uint32)((ulong)in_RCX >> 0x20),(ma_vfs_file *)0x2351a2);
  }
  else {
    mVar1 = ma_vfs_open_w((ma_vfs *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,(ma_uint32)((ulong)in_RSI >> 0x20),
                          (ma_vfs_file *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_or_default_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pVFS != NULL) {
        return ma_vfs_open_w(pVFS, pFilePath, openMode, pFile);
    } else {
        return ma_default_vfs_open_w(pVFS, pFilePath, openMode, pFile);
    }
}